

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int OptInit(char **a,s_options *o,FILE *err)

{
  int iVar1;
  char *pcVar2;
  int local_28;
  int local_24;
  int i;
  int errcnt;
  FILE *err_local;
  s_options *o_local;
  char **a_local;
  
  local_24 = 0;
  argv = a;
  op = o;
  errstream = err;
  if (((a != (char **)0x0) && (*a != (char *)0x0)) && (o != (s_options *)0x0)) {
    for (local_28 = 1; argv[local_28] != (char *)0x0; local_28 = local_28 + 1) {
      if ((*argv[local_28] == '+') || (*argv[local_28] == '-')) {
        iVar1 = handleflags(local_28,err);
        local_24 = iVar1 + local_24;
      }
      else {
        pcVar2 = strchr(argv[local_28],0x3d);
        if (pcVar2 != (char *)0x0) {
          iVar1 = handleswitch(local_28,err);
          local_24 = iVar1 + local_24;
        }
      }
    }
  }
  if (local_24 < 1) {
    return 0;
  }
  fprintf((FILE *)err,"Valid command line options for \"%s\" are:\n",*a);
  OptPrint();
  exit(1);
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  argv = a;
  op = o;
  errstream = err;
  if( argv && *argv && op ){
    int i;
    for(i=1; argv[i]; i++){
      if( argv[i][0]=='+' || argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}